

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::handle
          (CombinedImageSamplerHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  Compiler *pCVar1;
  anon_class_8_2_a61a8770_for__M_pred __pred;
  SPIRFunction *caller;
  bool bVar2;
  uint32_t uVar3;
  CompilerError *pCVar4;
  reference ppSVar5;
  CombinedImageSampler *pCVar6;
  CombinedImageSampler *pCVar7;
  SPIRType *pSVar8;
  bool local_1e1;
  bool local_1c9;
  uint32_t local_1b4;
  uint32_t local_1a4;
  bool local_182;
  bool local_181;
  CombinedImageSampler local_16c;
  SPIRType *local_160;
  SPIRType *parent_type;
  SPIRVariable *var_1;
  ID local_148;
  ID local_144;
  bool local_13d;
  int local_13c;
  StorageClass SStack_138;
  bool relaxed_precision;
  TypedID<(spirv_cross::Types)1> local_134;
  SPIRType *local_130;
  SPIRType *base;
  SPIRType *local_120;
  SPIRType *type_3;
  uint32_t local_110;
  uint32_t combined_id_1;
  uint32_t type_id;
  uint32_t id_2;
  SPIRType *local_100;
  SPIRType *type_4;
  uint32_t combined_module_id;
  uint32_t sampled_type;
  CombinedImageSampler *local_e8;
  CombinedImageSampler *itr;
  VariableID local_d8;
  VariableID sampler_id;
  VariableID image_id;
  VariableID local_cc;
  SPIRType *local_c8;
  SPIRType *combined_type;
  SPIRVariable *pSStack_b8;
  uint32_t combined_id;
  SPIRVariable *sampler;
  SPIRVariable *pSStack_a8;
  uint32_t sampler_id_1;
  SPIRVariable *image;
  value_type pSStack_98;
  uint32_t image_id_1;
  SPIRFunction *callee;
  SPIRType *type_2;
  SPIRVariable *var;
  uint32_t local_78;
  uint32_t ptr_1;
  uint32_t id_1;
  undefined1 local_62;
  bool local_61;
  bool separate_sampler_1;
  SPIRType *pSStack_60;
  bool separate_image_1;
  SPIRType *type_1;
  bool local_4d;
  uint32_t result_type_1;
  uint32_t local_48;
  uint32_t ptr;
  uint32_t id;
  bool separate_sampler;
  bool separate_image;
  SPIRType *type;
  byte local_2d;
  uint32_t result_type;
  bool is_fetch;
  uint32_t *puStack_28;
  uint32_t length_local;
  uint32_t *args_local;
  CombinedImageSamplerHandler *pCStack_18;
  Op opcode_local;
  CombinedImageSamplerHandler *this_local;
  
  local_2d = 0;
  result_type = length;
  puStack_28 = args;
  args_local._4_4_ = opcode;
  pCStack_18 = this;
  switch(opcode) {
  case OpLoad:
    if (length < 3) {
      this_local._7_1_ = false;
    }
    else {
      type._4_4_ = *args;
      _id = get<spirv_cross::SPIRType>(this->compiler,type._4_4_);
      local_181 = false;
      if (_id->basetype == Image) {
        local_181 = (_id->image).sampled == 1;
      }
      ptr._3_1_ = local_181;
      ptr._2_1_ = _id->basetype == Sampler;
      if ((local_181 != false) || ((bool)ptr._2_1_)) {
        local_48 = puStack_28[1];
        result_type_1 = puStack_28[2];
        local_4d = true;
        set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  (this->compiler,local_48,(char (*) [1])0x48ca95,(uint *)((long)&type + 4),
                   &local_4d);
        register_read(this->compiler,local_48,result_type_1,true);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    break;
  default:
    this_local._7_1_ = true;
    break;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
    if (length < 3) {
      this_local._7_1_ = false;
    }
    else {
      type_1._4_4_ = *args;
      pSStack_60 = get<spirv_cross::SPIRType>(this->compiler,type_1._4_4_);
      local_182 = false;
      if (pSStack_60->basetype == Image) {
        local_182 = (pSStack_60->image).sampled == 1;
      }
      local_61 = local_182;
      local_62 = pSStack_60->basetype == Sampler;
      if ((bool)local_62) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar4,
                   "Attempting to use arrays or structs of separate samplers. This is not possible to statically remap to plain GLSL."
                  );
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_182 != false) {
        local_78 = puStack_28[1];
        var._4_4_ = puStack_28[2];
        var._3_1_ = 1;
        set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  (this->compiler,local_78,(char (*) [1])0x48ca95,(uint *)((long)&type_1 + 4),
                   (bool *)((long)&var + 3));
        register_read(this->compiler,local_78,var._4_4_,true);
      }
      this_local._7_1_ = true;
    }
    break;
  case OpSampledImage:
    goto LAB_0043677e;
  case OpImageFetch:
  case OpImageQuerySizeLod:
  case OpImageQuerySize:
  case OpImageQueryLevels:
  case OpImageQuerySamples:
    type_2 = (SPIRType *)maybe_get_backing_variable(this->compiler,args[2]);
    if (type_2 == (SPIRType *)0x0) {
      return true;
    }
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_2->super_IVariant).field_0xc);
    callee = (SPIRFunction *)get<spirv_cross::SPIRType>(pCVar1,uVar3);
    if ((((callee->function_type).id != Image) ||
        (*(int *)((callee->shadow_arguments).stack_storage.aligned_char + 0x1c) != 1)) ||
       (*(int *)((callee->shadow_arguments).stack_storage.aligned_char + 0x14) == 5)) {
      return true;
    }
    if (this->compiler->dummy_sampler_id == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,
                 "texelFetch without sampler was found, but no dummy sampler has been created with build_dummy_sampler_for_combined_images()."
                );
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_2d = 1;
LAB_0043677e:
    bVar2 = ::std::
            stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
            ::empty(&this->functions);
    if (!bVar2) {
      ppSVar5 = ::std::
                stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
                ::top(&this->functions);
      pSStack_98 = *ppSVar5;
      if ((pSStack_98->do_combined_parameters & 1U) != 0) {
        image._4_4_ = puStack_28[2];
        pSStack_a8 = maybe_get_backing_variable(this->compiler,image._4_4_);
        if (pSStack_a8 != (SPIRVariable *)0x0) {
          image._4_4_ = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSStack_a8->super_IVariant).self);
        }
        if ((local_2d & 1) == 0) {
          local_1a4 = puStack_28[3];
        }
        else {
          local_1a4 = this->compiler->dummy_sampler_id;
        }
        sampler._4_4_ = local_1a4;
        pSStack_b8 = maybe_get_backing_variable(this->compiler,local_1a4);
        if (pSStack_b8 != (SPIRVariable *)0x0) {
          sampler._4_4_ =
               TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_b8->super_IVariant).self)
          ;
        }
        combined_type._4_4_ = puStack_28[1];
        local_c8 = get<spirv_cross::SPIRType>(this->compiler,*puStack_28);
        caller = pSStack_98;
        TypedID<(spirv_cross::Types)2>::TypedID(&local_cc,combined_type._4_4_);
        TypedID<(spirv_cross::Types)2>::TypedID(&image_id,image._4_4_);
        TypedID<(spirv_cross::Types)2>::TypedID(&sampler_id,sampler._4_4_);
        register_combined_image_sampler
                  (this,caller,local_cc,image_id,sampler_id,(bool)((local_c8->image).depth & 1));
      }
    }
    uVar3 = remap_parameter(this,puStack_28[2]);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_d8,uVar3);
    if ((local_2d & 1) == 0) {
      local_1b4 = remap_parameter(this,puStack_28[3]);
    }
    else {
      local_1b4 = this->compiler->dummy_sampler_id;
    }
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&itr + 4),local_1b4);
    pCVar6 = ::std::begin<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->compiler->combined_image_samplers);
    pCVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->compiler->combined_image_samplers);
    combined_module_id = local_d8.id;
    sampled_type = itr._4_4_;
    __pred.sampler_id.id = itr._4_4_;
    __pred.image_id.id = local_d8.id;
    pCVar6 = ::std::
             find_if<spirv_cross::CombinedImageSampler*,spirv_cross::Compiler::CombinedImageSamplerHandler::handle(spv::Op,unsigned_int_const*,unsigned_int)::__0>
                       (pCVar6,pCVar7,__pred);
    local_e8 = pCVar6;
    pCVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->compiler->combined_image_samplers);
    if (pCVar6 == pCVar7) {
      if ((local_2d & 1) == 0) {
        type_4._4_4_ = *puStack_28;
        type_4._0_4_ = puStack_28[1];
      }
      else {
        type_4._4_4_ = ParsedIR::increase_bound_by(&this->compiler->ir,1);
        id_2 = 0x1b;
        local_100 = set<spirv_cross::SPIRType,spv::Op>(this->compiler,type_4._4_4_,&id_2);
        pSVar8 = expression_type(this->compiler,puStack_28[2]);
        SPIRType::operator=(local_100,pSVar8);
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&type_id,type_4._4_4_);
        (local_100->super_IVariant).self.id = type_id;
        local_100->basetype = SampledImage;
        (local_100->image).depth = false;
        type_4._0_4_ = 0;
      }
      local_110 = ParsedIR::increase_bound_by(&this->compiler->ir,2);
      type_3._4_4_ = local_110 + 1;
      base._4_4_ = 0x20;
      combined_id_1 = local_110;
      local_120 = set<spirv_cross::SPIRType,spv::Op>
                            (this->compiler,local_110,(Op *)((long)&base + 4));
      local_130 = get<spirv_cross::SPIRType>(this->compiler,type_4._4_4_);
      SPIRType::operator=(local_120,local_130);
      local_120->pointer = true;
      local_120->storage = StorageClassUniformConstant;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_134,local_110);
      (local_120->parent_type).id = local_134.id;
      SStack_138 = StorageClassUniformConstant;
      local_13c = 0;
      set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
                (this->compiler,type_3._4_4_,&local_110,&stack0xfffffffffffffec8,&local_13c);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&itr + 4));
      if (uVar3 == 0) {
LAB_00436ca1:
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_d8);
        if (uVar3 != 0) {
          pCVar1 = this->compiler;
          TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>(&local_148,&local_d8);
          bVar2 = has_decoration(pCVar1,local_148,DecorationRelaxedPrecision);
          local_1c9 = true;
          if (bVar2) goto LAB_00436d55;
        }
        local_1e1 = false;
        if ((uint32_t)type_4 != 0) {
          pCVar1 = this->compiler;
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)((long)&var_1 + 4),(uint32_t)type_4);
          local_1e1 = has_decoration(pCVar1,var_1._4_4_,DecorationRelaxedPrecision);
        }
        local_1c9 = local_1e1;
      }
      else {
        pCVar1 = this->compiler;
        TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                  (&local_144,(TypedID<(spirv_cross::Types)2> *)((long)&itr + 4));
        bVar2 = has_decoration(pCVar1,local_144,DecorationRelaxedPrecision);
        local_1c9 = true;
        if (!bVar2) goto LAB_00436ca1;
      }
LAB_00436d55:
      local_13d = local_1c9;
      if (local_1c9 != false) {
        pCVar1 = this->compiler;
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&var_1,type_3._4_4_);
        set_decoration(pCVar1,var_1._0_4_,DecorationRelaxedPrecision,0);
      }
      pCVar1 = this->compiler;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_d8);
      parent_type = (SPIRType *)maybe_get_backing_variable(pCVar1,uVar3);
      if (parent_type != (SPIRType *)0x0) {
        pCVar1 = this->compiler;
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(parent_type->super_IVariant).field_0xc);
        local_160 = get<spirv_cross::SPIRType>(pCVar1,uVar3);
        SmallVector<unsigned_int,_8UL>::operator=(&local_120->array,&local_160->array);
        SmallVector<bool,_8UL>::operator=
                  (&local_120->array_size_literal,&local_160->array_size_literal);
      }
      pCVar1 = this->compiler;
      TypedID<(spirv_cross::Types)2>::TypedID(&local_16c.combined_id,type_3._4_4_);
      local_16c.image_id.id = local_d8.id;
      local_16c.sampler_id.id = itr._4_4_;
      SmallVector<spirv_cross::CombinedImageSampler,_8UL>::push_back
                (&pCVar1->combined_image_samplers,&local_16c);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// We need to figure out where samplers and images are loaded from, so do only the bare bones compilation we need.
	bool is_fetch = false;

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;

		// If not separate image or sampler, don't bother.
		if (!separate_image && !separate_sampler)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		return true;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Technically, it is possible to have arrays of textures and arrays of samplers and combine them, but this becomes essentially
		// impossible to implement, since we don't know which concrete sampler we are accessing.
		// One potential way is to create a combinatorial explosion where N textures and M samplers are combined into N * M sampler2Ds,
		// but this seems ridiculously complicated for a problem which is easy to work around.
		// Checking access chains like this assumes we don't have samplers or textures inside uniform structs, but this makes no sense.

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;
		if (separate_sampler)
			SPIRV_CROSS_THROW(
			    "Attempting to use arrays or structs of separate samplers. This is not possible to statically "
			    "remap to plain GLSL.");

		if (separate_image)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
		}
		return true;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching from a plain OpTypeImage or querying LOD, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (!var)
			return true;

		auto &type = compiler.get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (compiler.dummy_sampler_id == 0)
				SPIRV_CROSS_THROW("texelFetch without sampler was found, but no dummy sampler has been created with "
				                  "build_dummy_sampler_for_combined_images().");

			// Do it outside.
			is_fetch = true;
			break;
		}

		return true;
	}

	case OpSampledImage:
		// Do it outside.
		break;

	default:
		return true;
	}

	// Registers sampler2D calls used in case they are parameters so
	// that their callees know which combined image samplers to propagate down the call stack.
	if (!functions.empty())
	{
		auto &callee = *functions.top();
		if (callee.do_combined_parameters)
		{
			uint32_t image_id = args[2];

			auto *image = compiler.maybe_get_backing_variable(image_id);
			if (image)
				image_id = image->self;

			uint32_t sampler_id = is_fetch ? compiler.dummy_sampler_id : args[3];
			auto *sampler = compiler.maybe_get_backing_variable(sampler_id);
			if (sampler)
				sampler_id = sampler->self;

			uint32_t combined_id = args[1];

			auto &combined_type = compiler.get<SPIRType>(args[0]);
			register_combined_image_sampler(callee, combined_id, image_id, sampler_id, combined_type.image.depth);
		}
	}

	// For function calls, we need to remap IDs which are function parameters into global variables.
	// This information is statically known from the current place in the call stack.
	// Function parameters are not necessarily pointers, so if we don't have a backing variable, remapping will know
	// which backing variable the image/sample came from.
	VariableID image_id = remap_parameter(args[2]);
	VariableID sampler_id = is_fetch ? compiler.dummy_sampler_id : remap_parameter(args[3]);

	auto itr = find_if(begin(compiler.combined_image_samplers), end(compiler.combined_image_samplers),
	                   [image_id, sampler_id](const CombinedImageSampler &combined) {
		                   return combined.image_id == image_id && combined.sampler_id == sampler_id;
	                   });

	if (itr == end(compiler.combined_image_samplers))
	{
		uint32_t sampled_type;
		uint32_t combined_module_id;
		if (is_fetch)
		{
			// Have to invent the sampled image type.
			sampled_type = compiler.ir.increase_bound_by(1);
			auto &type = compiler.set<SPIRType>(sampled_type, OpTypeSampledImage);
			type = compiler.expression_type(args[2]);
			type.self = sampled_type;
			type.basetype = SPIRType::SampledImage;
			type.image.depth = false;
			combined_module_id = 0;
		}
		else
		{
			sampled_type = args[0];
			combined_module_id = args[1];
		}

		auto id = compiler.ir.increase_bound_by(2);
		auto type_id = id + 0;
		auto combined_id = id + 1;

		// Make a new type, pointer to OpTypeSampledImage, so we can make a variable of this type.
		// We will probably have this type lying around, but it doesn't hurt to make duplicates for internal purposes.
		auto &type = compiler.set<SPIRType>(type_id, OpTypePointer);
		auto &base = compiler.get<SPIRType>(sampled_type);
		type = base;
		type.pointer = true;
		type.storage = StorageClassUniformConstant;
		type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, type_id, StorageClassUniformConstant, 0);

		// Inherit RelaxedPrecision (and potentially other useful flags if deemed relevant).
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    (sampler_id && compiler.has_decoration(sampler_id, DecorationRelaxedPrecision)) ||
		    (image_id && compiler.has_decoration(image_id, DecorationRelaxedPrecision)) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		// Propagate the array type for the original image as well.
		auto *var = compiler.maybe_get_backing_variable(image_id);
		if (var)
		{
			auto &parent_type = compiler.get<SPIRType>(var->basetype);
			type.array = parent_type.array;
			type.array_size_literal = parent_type.array_size_literal;
		}

		compiler.combined_image_samplers.push_back({ combined_id, image_id, sampler_id });
	}

	return true;
}